

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O1

void canvas_texteditor(_glist *x)

{
  _rtext *x_00;
  int bufsize;
  char *buf;
  uint local_c;
  char *local_8;
  
  x_00 = x->gl_editor->e_textedfor;
  if (x_00 == (_rtext *)0x0) {
    local_8 = "";
    local_c = 0;
  }
  else {
    rtext_gettext(x_00,&local_8,(int *)&local_c);
  }
  pdgui_vmess("pdtk_pd_texteditor","p",(ulong)local_c,local_8);
  return;
}

Assistant:

static void canvas_texteditor(t_canvas *x)
{
    t_rtext *foo;
    char *buf;
    int bufsize;
    if ((foo = x->gl_editor->e_textedfor))
        rtext_gettext(foo, &buf, &bufsize);
    else buf = "", bufsize = 0;
    pdgui_vmess("pdtk_pd_texteditor", "p", bufsize, buf);
}